

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathCompOpEvalFirst(xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodePtr *first)

{
  int *piVar1;
  xmlXPathCompExprPtr pxVar2;
  xmlXPathObjectPtr *ppxVar3;
  int iVar4;
  uint uVar5;
  xmlXPathOp xVar6;
  int iVar7;
  xmlXPathContextPtr pxVar8;
  xmlXPathObjectPtr pxVar9;
  xmlNodeSetPtr pxVar10;
  uint uVar11;
  xmlXPathObjectPtr pxVar12;
  
  if (ctxt->error != 0) {
    return 0;
  }
  pxVar8 = ctxt->context;
  if (pxVar8->opLimit != 0) {
    iVar4 = xmlXPathCheckOpLimit(ctxt,1);
    if (iVar4 < 0) {
      return 0;
    }
    pxVar8 = ctxt->context;
  }
  if (4999 < pxVar8->depth) {
    iVar4 = 0x1a;
    goto LAB_001c5ec2;
  }
  pxVar8->depth = pxVar8->depth + 1;
  xVar6 = op->op;
  if (XPATH_OP_SORT < xVar6) {
switchD_001c5ef1_caseD_1:
    xVar6 = xmlXPathCompOpEval(ctxt,op);
    goto switchD_001c5ef1_caseD_0;
  }
  pxVar2 = ctxt->comp;
  switch(xVar6) {
  case XPATH_OP_END:
    break;
  default:
    goto switchD_001c5ef1_caseD_1;
  case XPATH_OP_UNION:
    xVar6 = xmlXPathCompOpEvalFirst(ctxt,pxVar2->steps + op->ch1,first);
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar9 = ctxt->value;
    if (((pxVar9 != (xmlXPathObjectPtr)0x0) && (pxVar9->type == XPATH_NODESET)) &&
       (pxVar10 = pxVar9->nodesetval, pxVar10 != (xmlNodeSetPtr)0x0)) {
      iVar4 = pxVar10->nodeNr;
      if (0 < (long)iVar4) {
        if (iVar4 != 1) {
          libxml_domnode_tim_sort(pxVar10->nodeTab,(long)iVar4);
          pxVar10 = ctxt->value->nodesetval;
        }
        *first = *pxVar10->nodeTab;
      }
    }
    iVar4 = xmlXPathCompOpEvalFirst(ctxt,pxVar2->steps + op->ch2,first);
    if (ctxt->error != 0) {
      return 0;
    }
    iVar7 = ctxt->valueNr;
    if ((long)iVar7 < 1) {
      pxVar9 = (xmlXPathObjectPtr)0x0;
LAB_001c6247:
      pxVar12 = (xmlXPathObjectPtr)0x0;
    }
    else {
      uVar5 = iVar7 - 1;
      ctxt->valueNr = uVar5;
      ppxVar3 = ctxt->valueTab;
      if (iVar7 == 1) {
        pxVar12 = (xmlXPathObjectPtr)0x0;
        ctxt->value = (xmlXPathObjectPtr)0x0;
        pxVar9 = ppxVar3[uVar5];
        ppxVar3[uVar5] = (xmlXPathObjectPtr)0x0;
      }
      else {
        ctxt->value = ppxVar3[(long)iVar7 + -2];
        pxVar9 = ppxVar3[uVar5];
        ppxVar3[uVar5] = (xmlXPathObjectPtr)0x0;
        uVar11 = iVar7 - 2;
        ctxt->valueNr = uVar11;
        ppxVar3 = ctxt->valueTab;
        if (uVar5 == 1) {
          pxVar12 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar12 = ppxVar3[(ulong)uVar5 - 2];
        }
        ctxt->value = pxVar12;
        pxVar12 = ppxVar3[uVar11];
        ppxVar3[uVar11] = (xmlXPathObjectPtr)0x0;
        if (pxVar12 == (xmlXPathObjectPtr)0x0) goto LAB_001c6247;
        if (((pxVar12->type == XPATH_NODESET) && (pxVar9 != (xmlXPathObjectPtr)0x0)) &&
           (pxVar9->type == XPATH_NODESET)) {
          if ((ctxt->context->opLimit == 0) ||
             (((pxVar12->nodesetval == (xmlNodeSetPtr)0x0 ||
               (iVar7 = xmlXPathCheckOpLimit(ctxt,(long)pxVar12->nodesetval->nodeNr), -1 < iVar7))
              && ((pxVar9->nodesetval == (xmlNodeSetPtr)0x0 ||
                  (iVar7 = xmlXPathCheckOpLimit(ctxt,(long)pxVar9->nodesetval->nodeNr), -1 < iVar7))
                 )))) {
            pxVar10 = pxVar9->nodesetval;
            if ((pxVar10 != (xmlNodeSetPtr)0x0) && (pxVar10->nodeNr != 0)) {
              pxVar10 = xmlXPathNodeSetMerge(pxVar12->nodesetval,pxVar10);
              pxVar12->nodesetval = pxVar10;
              if (pxVar10 == (xmlNodeSetPtr)0x0) {
                xmlXPathPErrMemory(ctxt);
              }
            }
            xmlXPathValuePush(ctxt,pxVar12);
            xmlXPathReleaseObject(ctxt->context,pxVar9);
            xVar6 = iVar4 + xVar6;
          }
          else {
            xmlXPathReleaseObject(ctxt->context,pxVar12);
            xmlXPathReleaseObject(ctxt->context,pxVar9);
          }
          break;
        }
      }
    }
    xmlXPathReleaseObject(ctxt->context,pxVar12);
    xmlXPathReleaseObject(ctxt->context,pxVar9);
    iVar4 = 0xb;
LAB_001c5ec2:
    xmlXPathErr(ctxt,iVar4);
    return 0;
  case XPATH_OP_ROOT:
    xmlXPathRoot(ctxt);
    goto LAB_001c6134;
  case XPATH_OP_NODE:
    xVar6 = XPATH_OP_END;
    if ((long)op->ch1 != -1) {
      xVar6 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
    }
    if (ctxt->error != 0) {
      return 0;
    }
    if ((long)op->ch2 != -1) {
      iVar4 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch2);
      if (ctxt->error != 0) {
        return 0;
      }
      xVar6 = iVar4 + xVar6;
    }
    pxVar9 = xmlXPathCacheNewNodeSet(ctxt,ctxt->context->node);
    xmlXPathValuePush(ctxt,pxVar9);
    break;
  case XPATH_OP_COLLECT:
    if ((long)op->ch1 != -1) {
      iVar4 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
      if (ctxt->error != 0) {
        return 0;
      }
      iVar7 = xmlXPathNodeCollectAndTest(ctxt,op,first,(xmlNodePtr *)0x0,0);
      xVar6 = iVar7 + iVar4;
      break;
    }
    goto LAB_001c6134;
  case XPATH_OP_VALUE:
    pxVar9 = xmlXPathCacheObjectCopy(ctxt,(xmlXPathObjectPtr)op->value4);
    xmlXPathValuePush(ctxt,pxVar9);
LAB_001c6134:
    xVar6 = XPATH_OP_END;
    break;
  case XPATH_OP_FILTER:
    xVar6 = xmlXPathCompOpEvalFilterFirst(ctxt,op,first);
    break;
  case XPATH_OP_SORT:
    xVar6 = XPATH_OP_END;
    if ((long)op->ch1 != -1) {
      xVar6 = xmlXPathCompOpEvalFirst(ctxt,pxVar2->steps + op->ch1,first);
    }
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar9 = ctxt->value;
    if ((((pxVar9 != (xmlXPathObjectPtr)0x0) && (pxVar9->type == XPATH_NODESET)) &&
        (pxVar10 = pxVar9->nodesetval, pxVar10 != (xmlNodeSetPtr)0x0)) &&
       (1 < (long)pxVar10->nodeNr)) {
      libxml_domnode_tim_sort(pxVar10->nodeTab,(long)pxVar10->nodeNr);
    }
  }
switchD_001c5ef1_caseD_0:
  piVar1 = &ctxt->context->depth;
  *piVar1 = *piVar1 + -1;
  return xVar6;
}

Assistant:

static int
xmlXPathCompOpEvalFirst(xmlXPathParserContextPtr ctxt,
                        xmlXPathStepOpPtr op, xmlNodePtr * first)
{
    int total = 0, cur;
    xmlXPathCompExprPtr comp;
    xmlXPathObjectPtr arg1, arg2;

    CHECK_ERROR0;
    if (OP_LIMIT_EXCEEDED(ctxt, 1))
        return(0);
    if (ctxt->context->depth >= XPATH_MAX_RECURSION_DEPTH)
        XP_ERROR0(XPATH_RECURSION_LIMIT_EXCEEDED);
    ctxt->context->depth += 1;
    comp = ctxt->comp;
    switch (op->op) {
        case XPATH_OP_END:
            break;
        case XPATH_OP_UNION:
            total =
                xmlXPathCompOpEvalFirst(ctxt, &comp->steps[op->ch1],
                                        first);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL)
                && (ctxt->value->type == XPATH_NODESET)
                && (ctxt->value->nodesetval != NULL)
                && (ctxt->value->nodesetval->nodeNr >= 1)) {
                /*
                 * limit tree traversing to first node in the result
                 */
		/*
		* OPTIMIZE TODO: This implicitly sorts
		*  the result, even if not needed. E.g. if the argument
		*  of the count() function, no sorting is needed.
		* OPTIMIZE TODO: How do we know if the node-list wasn't
		*  already sorted?
		*/
		if (ctxt->value->nodesetval->nodeNr > 1)
		    xmlXPathNodeSetSort(ctxt->value->nodesetval);
                *first = ctxt->value->nodesetval->nodeTab[0];
            }
            cur =
                xmlXPathCompOpEvalFirst(ctxt, &comp->steps[op->ch2],
                                        first);
	    CHECK_ERROR0;

            arg2 = xmlXPathValuePop(ctxt);
            arg1 = xmlXPathValuePop(ctxt);
            if ((arg1 == NULL) || (arg1->type != XPATH_NODESET) ||
                (arg2 == NULL) || (arg2->type != XPATH_NODESET)) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                XP_ERROR0(XPATH_INVALID_TYPE);
            }
            if ((ctxt->context->opLimit != 0) &&
                (((arg1->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg1->nodesetval->nodeNr) < 0)) ||
                 ((arg2->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg2->nodesetval->nodeNr) < 0)))) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                break;
            }

            if ((arg2->nodesetval != NULL) &&
                (arg2->nodesetval->nodeNr != 0)) {
                arg1->nodesetval = xmlXPathNodeSetMerge(arg1->nodesetval,
                                                        arg2->nodesetval);
                if (arg1->nodesetval == NULL)
                    xmlXPathPErrMemory(ctxt);
            }
            xmlXPathValuePush(ctxt, arg1);
	    xmlXPathReleaseObject(ctxt->context, arg2);
            total += cur;
            break;
        case XPATH_OP_ROOT:
            xmlXPathRoot(ctxt);
            break;
        case XPATH_OP_NODE:
            if (op->ch1 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if (op->ch2 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt,
		ctxt->context->node));
            break;
        case XPATH_OP_COLLECT:{
                if (op->ch1 == -1)
                    break;

                total = xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
		CHECK_ERROR0;

                total += xmlXPathNodeCollectAndTest(ctxt, op, first, NULL, 0);
                break;
            }
        case XPATH_OP_VALUE:
            xmlXPathValuePush(ctxt, xmlXPathCacheObjectCopy(ctxt, op->value4));
            break;
        case XPATH_OP_SORT:
            if (op->ch1 != -1)
                total +=
                    xmlXPathCompOpEvalFirst(ctxt, &comp->steps[op->ch1],
                                            first);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL)
                && (ctxt->value->type == XPATH_NODESET)
                && (ctxt->value->nodesetval != NULL)
		&& (ctxt->value->nodesetval->nodeNr > 1))
                xmlXPathNodeSetSort(ctxt->value->nodesetval);
            break;
#ifdef XP_OPTIMIZED_FILTER_FIRST
	case XPATH_OP_FILTER:
                total += xmlXPathCompOpEvalFilterFirst(ctxt, op, first);
            break;
#endif
        default:
            total += xmlXPathCompOpEval(ctxt, op);
            break;
    }

    ctxt->context->depth -= 1;
    return(total);
}